

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS
ref_node_dratio_dnode0_quadrature
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_DBL *ratio,REF_DBL *d_ratio)

{
  REF_DBL *pRVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  REF_DBL ratio_func;
  REF_DBL ratio_deriv [3];
  REF_DBL direction [3];
  REF_DBL m [6];
  REF_DBL mlog [6];
  REF_DBL mlog1 [6];
  REF_DBL mlog0 [6];
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_108;
  double local_100;
  double local_f8;
  REF_DBL local_e8 [6];
  REF_DBL local_b8 [6];
  REF_DBL aRStack_88 [6];
  REF_DBL aRStack_58 [7];
  
  lVar5 = 0;
  *ratio = 0.0;
  d_ratio[2] = 0.0;
  *d_ratio = 0.0;
  d_ratio[1] = 0.0;
  pRVar1 = ref_node->real;
  iVar2 = node1 * 0xf;
  lVar4 = (long)(node0 * 0xf);
  local_108 = pRVar1[iVar2] - pRVar1[lVar4];
  local_100 = pRVar1[(long)iVar2 + 1] - pRVar1[lVar4 + 1];
  local_f8 = pRVar1[(long)iVar2 + 2] - pRVar1[lVar4 + 2];
  do {
    aRStack_58[lVar5] = pRVar1[node0 * 0xf + 9 + (int)lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  lVar4 = 0;
  do {
    aRStack_88[lVar4] = pRVar1[iVar2 + 9 + (int)lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  lVar4 = 0;
  do {
    local_b8[lVar4] = aRStack_58[lVar4] * 0.5 + aRStack_88[lVar4] * 0.5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  uVar3 = ref_matrix_exp_m(local_b8,local_e8);
  if (uVar3 == 0) {
    uVar3 = ref_matrix_sqrt_vt_m_v_deriv(local_e8,&local_108,&local_130,&local_128);
    if (uVar3 == 0) {
      *ratio = local_130 + *ratio;
      *d_ratio = *d_ratio - local_128;
      d_ratio[1] = d_ratio[1] - local_120;
      d_ratio[2] = d_ratio[2] - local_118;
      uVar3 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x5db,
             "ref_node_dratio_dnode0_quadrature",(ulong)uVar3,"vt m v0");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x5d9,
           "ref_node_dratio_dnode0_quadrature",(ulong)uVar3,"exp");
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_node_dratio_dnode0_quadrature(REF_NODE ref_node,
                                                            REF_INT node0,
                                                            REF_INT node1,
                                                            REF_DBL *ratio,
                                                            REF_DBL *d_ratio) {
  REF_DBL mlog0[6], mlog1[6];
  REF_DBL mlog[6], m[6];
  REF_DBL direction[3];
  REF_INT im;
  REF_DBL w0, w1;
  REF_INT i;
  REF_DBL ratio_func, ratio_deriv[3];

  /*
  REF_INT n = 3;
  REF_DBL x[] = {-sqrt(3.0 / 5.0), 0.0, sqrt(3.0 / 5.0)};
  REF_DBL w[] = {5.0 / 9.0, 8.0 / 9.0, 5.0 / 9.0};
  */
  REF_INT n = 1;
  REF_DBL x[] = {0.0};
  REF_DBL w[] = {2.0};

  *ratio = 0.0;
  d_ratio[0] = 0.0;
  d_ratio[1] = 0.0;
  d_ratio[2] = 0.0;

  direction[0] =
      (ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0));
  direction[1] =
      (ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0));
  direction[2] =
      (ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0));
  RSS(ref_node_metric_get_log(ref_node, node0, mlog0), "node0 m");
  RSS(ref_node_metric_get_log(ref_node, node1, mlog1), "node1 m");

  for (i = 0; i < n; i++) {
    w1 = 0.5 * x[i] + 0.5;
    w0 = 1.0 - w1;
    for (im = 0; im < 6; im++) {
      mlog[im] = w0 * mlog0[im] + w1 * mlog1[im];
    }
    RSS(ref_matrix_exp_m(mlog, m), "exp");
    RSS(ref_matrix_sqrt_vt_m_v_deriv(m, direction, &ratio_func, ratio_deriv),
        "vt m v0");
    *ratio += 0.5 * w[i] * ratio_func;
    d_ratio[0] -= 0.5 * w[i] * ratio_deriv[0];
    d_ratio[1] -= 0.5 * w[i] * ratio_deriv[1];
    d_ratio[2] -= 0.5 * w[i] * ratio_deriv[2];
  }

  return REF_SUCCESS;
}